

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O1

void __thiscall QEvdevMouseManager::addMouse(QEvdevMouseManager *this,QString *deviceNode)

{
  unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> uVar1;
  QLoggingCategory *pQVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> local_88;
  QObject local_80 [8];
  code *local_78;
  ImplFn local_70;
  QObject local_68 [8];
  unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_> handler;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QtPrivateLogging::qLcEvdevMouse();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar2->name;
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 0;
    uVar3 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Adding mouse at %ls",uVar3);
  }
  handler._M_t.super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>.
  _M_t.super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
  super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl =
       (__uniq_ptr_data<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QEvdevMouseHandler::create((QEvdevMouseHandler *)&handler,deviceNode,&this->m_spec);
  uVar1 = handler;
  if ((__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)
      handler._M_t.
      super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>._M_t.
      super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
      super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)0x0) {
    addMouse();
  }
  else {
    local_78 = handleMouseEvent;
    local_70 = (ImplFn)0x0;
    local_58 = 0x1094c8;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<void_(QEvdevMouseManager::*)(int,_int,_bool,_QFlags<Qt::MouseButton>,_Qt::MouseButton,_QEvent::Type),_QtPrivate::List<int,_int,_bool,_QFlags<Qt::MouseButton>,_Qt::MouseButton,_QEvent::Type>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = handleMouseEvent;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)uVar1._M_t.
                                 super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>
                                 .super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl,
               (QObject *)&local_58,(void **)this,(QSlotObjectBase *)&local_78,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    uVar1 = handler;
    local_78 = handleWheelEvent;
    local_70 = (ImplFn)0x0;
    local_58 = 0x109568;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QCallableObject<void_(QEvdevMouseManager::*)(QPoint),_QtPrivate::List<QPoint>,_void>::impl;
    *(code **)(puVar4 + 4) = handleWheelEvent;
    *(undefined8 *)(puVar4 + 6) = 0;
    QObject::connectImpl
              (local_80,(void **)uVar1._M_t.
                                 super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>
                                 .super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl,
               (QObject *)&local_58,(void **)this,(QSlotObjectBase *)&local_78,
               (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    local_88._M_t.
    super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
    super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl =
         (tuple<QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>)
         (tuple<QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>)
         handler._M_t.
         super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>._M_t.
         super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
         super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl;
    handler._M_t.super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>
    ._M_t.super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
    super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl =
         (__uniq_ptr_data<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>,_true,_true>)
         (__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)0x0;
    QtInputSupport::DeviceHandlerList<QEvdevMouseHandler>::add
              (&this->m_mice,deviceNode,
               (unique_ptr<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)&local_88);
    if ((_Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>)
        local_88._M_t.
        super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
        super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl != (QEvdevMouseHandler *)0x0
       ) {
      (**(code **)(*(long *)local_88._M_t.
                            super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>
                            .super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl + 0x20)
      )();
    }
    local_88._M_t.
    super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
    super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl =
         (tuple<QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>)
         (_Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>)0x0;
    lVar5 = QGuiApplicationPrivate::inputDeviceManager();
    QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar5 + 8),1);
  }
  if ((__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)
      handler._M_t.
      super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>._M_t.
      super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>.
      super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>)0x0) {
    (**(code **)(*(long *)handler._M_t.
                          super___uniq_ptr_impl<QEvdevMouseHandler,_std::default_delete<QEvdevMouseHandler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QEvdevMouseHandler_*,_std::default_delete<QEvdevMouseHandler>_>
                          .super__Head_base<0UL,_QEvdevMouseHandler_*,_false>._M_head_impl + 0x20))
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevMouseManager::addMouse(const QString &deviceNode)
{
    qCDebug(qLcEvdevMouse, "Adding mouse at %ls", qUtf16Printable(deviceNode));
    auto handler = QEvdevMouseHandler::create(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevMouseHandler::handleMouseEvent,
                this, &QEvdevMouseManager::handleMouseEvent);
        connect(handler.get(), &QEvdevMouseHandler::handleWheelEvent,
                this, &QEvdevMouseManager::handleWheelEvent);
        m_mice.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevmouse: Failed to open mouse device %ls", qUtf16Printable(deviceNode));
    }
}